

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void pugi::impl::anon_unknown_0::node_copy_tree(xml_node_struct *dn,xml_node_struct *sn)

{
  xml_allocator *alloc;
  bool bVar1;
  xml_node_struct *pxVar2;
  xml_allocator *shared_alloc;
  xml_node_struct *node;
  xml_node_struct *sn_00;
  
  alloc = *(xml_allocator **)((long)dn - (dn->header >> 8));
  shared_alloc = (xml_allocator *)0x0;
  if (alloc == *(xml_allocator **)((long)sn - (sn->header >> 8))) {
    shared_alloc = alloc;
  }
  node_copy_contents(dn,sn,shared_alloc);
  sn_00 = sn->first_child;
  node = dn;
  if (sn_00 != sn && sn_00 != (xml_node_struct *)0x0) {
    do {
      if (sn_00 == dn) {
LAB_00157e4c:
        do {
          pxVar2 = sn_00->next_sibling;
          if (sn_00->next_sibling != (xml_node_struct *)0x0) break;
          sn_00 = sn_00->parent;
          node = node->parent;
          pxVar2 = sn_00;
        } while (sn_00 != sn);
      }
      else {
        pxVar2 = append_new_node(node,alloc,
                                 (xml_node_type)sn_00->header & (node_doctype|node_declaration));
        if (pxVar2 == (xml_node_struct *)0x0) {
LAB_00157e46:
          bVar1 = true;
        }
        else {
          node_copy_contents(pxVar2,sn_00,shared_alloc);
          if (sn_00->first_child == (xml_node_struct *)0x0) goto LAB_00157e46;
          bVar1 = false;
          node = pxVar2;
          sn_00 = sn_00->first_child;
        }
        pxVar2 = sn_00;
        if (bVar1) goto LAB_00157e4c;
      }
    } while ((pxVar2 != (xml_node_struct *)0x0) && (sn_00 = pxVar2, pxVar2 != sn));
  }
  return;
}

Assistant:

PUGI_IMPL_FN void node_copy_tree(xml_node_struct* dn, xml_node_struct* sn)
	{
		xml_allocator& alloc = get_allocator(dn);
		xml_allocator* shared_alloc = (&alloc == &get_allocator(sn)) ? &alloc : NULL;

		node_copy_contents(dn, sn, shared_alloc);

		xml_node_struct* dit = dn;
		xml_node_struct* sit = sn->first_child;

		while (sit && sit != sn)
		{
			// loop invariant: dit is inside the subtree rooted at dn
			assert(dit);

			// when a tree is copied into one of the descendants, we need to skip that subtree to avoid an infinite loop
			if (sit != dn)
			{
				xml_node_struct* copy = append_new_node(dit, alloc, PUGI_IMPL_NODETYPE(sit));

				if (copy)
				{
					node_copy_contents(copy, sit, shared_alloc);

					if (sit->first_child)
					{
						dit = copy;
						sit = sit->first_child;
						continue;
					}
				}
			}

			// continue to the next node
			do
			{
				if (sit->next_sibling)
				{
					sit = sit->next_sibling;
					break;
				}

				sit = sit->parent;
				dit = dit->parent;

				// loop invariant: dit is inside the subtree rooted at dn while sit is inside sn
				assert(sit == sn || dit);
			}
			while (sit != sn);
		}

		assert(!sit || dit == dn->parent);
	}